

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delta_mergable.cpp
# Opt level: O2

void __thiscall
cpp_client::Delta_mergable::Delta_mergable
          (Delta_mergable *this,
          initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any_&&>_>
          init)

{
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,cpp_client::Any>,std::allocator<std::pair<std::__cxx11::string_const,cpp_client::Any>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *p_Var1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>_>
  *puVar2;
  long lVar3;
  iterator __x;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>
  pStack_58;
  
  __x = init._M_array;
  this->_vptr_Delta_mergable = (_func_int **)&PTR___cxa_pure_virtual_00140660;
  puVar2 = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>_>
            *)operator_new(0x38);
  *(undefined8 *)&(puVar2->_M_h)._M_rehash_policy = 0;
  *(size_t *)((long)&(puVar2->_M_h)._M_rehash_policy + 8) = 0;
  (puVar2->_M_h)._M_buckets = &(puVar2->_M_h)._M_single_bucket;
  (puVar2->_M_h)._M_bucket_count = 1;
  (puVar2->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (puVar2->_M_h)._M_element_count = 0;
  (puVar2->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  *(size_t *)((long)&(puVar2->_M_h)._M_rehash_policy + 8) = 0;
  (puVar2->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  (this->variable_storage_)._M_t.
  super___uniq_ptr_impl<cpp_client::Delta_mergable_delay_variables,_std::default_delete<cpp_client::Delta_mergable_delay_variables>_>
  ._M_t.
  super__Tuple_impl<0UL,_cpp_client::Delta_mergable_delay_variables_*,_std::default_delete<cpp_client::Delta_mergable_delay_variables>_>
  .super__Head_base<0UL,_cpp_client::Delta_mergable_delay_variables_*,_false>._M_head_impl =
       (Delta_mergable_delay_variables *)puVar2;
  this->variables_ = puVar2;
  for (lVar3 = init._M_len * 0x28; lVar3 != 0; lVar3 = lVar3 + -0x28) {
    p_Var1 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,cpp_client::Any>,std::allocator<std::pair<std::__cxx11::string_const,cpp_client::Any>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)this->variables_;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>
    ::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any,_true>
              (&pStack_58,&__x->first,__x->second);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,cpp_client::Any>,std::allocator<std::pair<std::__cxx11::string_const,cpp_client::Any>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::pair<std::__cxx11::string,cpp_client::Any>>(p_Var1,&pStack_58);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>
    ::~pair(&pStack_58);
    __x = __x + 1;
  }
  return;
}

Assistant:

Delta_mergable::Delta_mergable(std::initializer_list<std::pair<std::string, Any&&>> init) :
   variable_storage_(new Delta_mergable_delay_variables{}),
   variables_(variable_storage_->variables_)
{
   for(auto&& obj : init)
   {
      variables_.emplace(std::make_pair(std::move(obj.first), std::move(obj.second)));
   }
}